

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

int __thiscall r_comp::Decompiler::init(Decompiler *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  int iVar2;
  Class *pCVar3;
  long lVar4;
  offset_in_Decompiler_to_subr *poVar5;
  ulong uVar6;
  code *pcVar7;
  size_t opcode;
  ushort uVar8;
  vector<void_(r_comp::Decompiler::*)(unsigned_short)> *this_00;
  string class_name;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->metadata = (Metadata *)ctx;
  this->time_offset = 0;
  this->partial_decompilation = false;
  this->ignore_named_objects = false;
  uVar6 = *(ulong *)(ctx + 0xf8);
  if (uVar6 != *(ulong *)(ctx + 0xf0)) {
    this_00 = &this->renderers;
    uVar8 = 1;
    opcode = 0;
    do {
      pCVar3 = Metadata::get_class((Metadata *)ctx,opcode);
      pcVar1 = (pCVar3->str_opcode)._M_dataplus._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + (pCVar3->str_opcode)._M_string_length);
      lVar4 = std::__cxx11::string::find((char *)local_50,0x13e7a9,0);
      if (lVar4 == -1) {
        iVar2 = std::__cxx11::string::compare((char *)local_50);
        if (iVar2 == 0) {
          poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                             (this_00,opcode);
          pcVar7 = write_group;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_50), iVar2 == 0))
          {
            poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                               (this_00,opcode);
            pcVar7 = write_ipgm;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_50);
            if ((iVar2 == 0) ||
               (iVar2 = std::__cxx11::string::compare((char *)local_50), iVar2 == 0)) {
              poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                 (this_00,opcode);
              pcVar7 = write_pgm;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)local_50);
              if (iVar2 == 0) {
                poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                   (this_00,opcode);
                pcVar7 = write_icmd;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)local_50);
                if (iVar2 == 0) {
                  poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                     (this_00,opcode);
                  pcVar7 = write_cmd;
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)local_50);
                  if ((iVar2 == 0) ||
                     (iVar2 = std::__cxx11::string::compare((char *)local_50), iVar2 == 0)) {
                    poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                             operator[](this_00,opcode);
                    pcVar7 = write_fact;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)local_50);
                    if ((iVar2 == 0) ||
                       (iVar2 = std::__cxx11::string::compare((char *)local_50), iVar2 == 0)) {
                      poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                               operator[](this_00,opcode);
                      pcVar7 = write_hlp;
                    }
                    else {
                      iVar2 = std::__cxx11::string::compare((char *)local_50);
                      if ((iVar2 == 0) ||
                         (iVar2 = std::__cxx11::string::compare((char *)local_50), iVar2 == 0)) {
                        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                                 operator[](this_00,opcode);
                        pcVar7 = write_ihlp;
                      }
                      else {
                        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                                 operator[](this_00,opcode);
                        pcVar7 = write_expression;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                           (this_00,opcode);
        pcVar7 = write_marker;
      }
      *poVar5 = (offset_in_Decompiler_to_subr)pcVar7;
      poVar5[1] = 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      opcode = (size_t)uVar8;
      uVar6 = (*(long *)(ctx + 0xf8) - *(long *)(ctx + 0xf0) >> 3) * -0x71c71c71c71c71c7;
      uVar8 = uVar8 + 1;
    } while (opcode <= uVar6 && uVar6 - opcode != 0);
  }
  return (int)uVar6;
}

Assistant:

void Decompiler::init(r_comp::Metadata *metadata)
{
    this->metadata = metadata;
    this->time_offset = 0;
    partial_decompilation = false;
    ignore_named_objects = false;

    // Load the renderers;
    for (uint16_t i = 0; i < metadata->classes_by_opcodes.size(); ++i) {
        Class *c = metadata->get_class(i);
        std::string class_name = c->str_opcode;
        size_t p = class_name.find("mk.");

        if (p != std::string::npos) {
            renderers[i] = &Decompiler::write_marker;
        } else if (class_name == "grp") {
            renderers[i] = &Decompiler::write_group;
        } else if (class_name == "ipgm" || class_name == "icpp_pgm") {
            renderers[i] = &Decompiler::write_ipgm;
        } else if (class_name == "pgm" || class_name == "|pgm") {
            renderers[i] = &Decompiler::write_pgm;
        } else if (class_name == "icmd") {
            renderers[i] = &Decompiler::write_icmd;
        } else if (class_name == "cmd") {
            renderers[i] = &Decompiler::write_cmd;
        } else if (class_name == "fact" || class_name == "|fact") {
            renderers[i] = &Decompiler::write_fact;
        } else if (class_name == "cst" || class_name == "mdl") {
            renderers[i] = &Decompiler::write_hlp;
        } else if (class_name == "icst" || class_name == "imdl") {
            renderers[i] = &Decompiler::write_ihlp;
        } else {
            renderers[i] = &Decompiler::write_expression;
        }
    }
}